

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GraphCycles(GraphCycles *this)

{
  uint uVar1;
  Rep *this_00;
  uint uVar2;
  bool bVar3;
  
  uVar1 = synchronization_internal::(anonymous_namespace)::arena_mu;
  if ((synchronization_internal::(anonymous_namespace)::arena_mu & 1) == 0) {
    synchronization_internal::(anonymous_namespace)::arena_mu =
         synchronization_internal::(anonymous_namespace)::arena_mu | 1;
    LOCK();
    UNLOCK();
  }
  if ((uVar1 & 1) != 0) {
    base_internal::SpinLock::SlowLock
              ((SpinLock *)&synchronization_internal::(anonymous_namespace)::arena_mu);
  }
  if (synchronization_internal::(anonymous_namespace)::arena == (Arena *)0x0) {
    synchronization_internal::(anonymous_namespace)::arena =
         base_internal::LowLevelAlloc::NewArena(0);
  }
  uVar1 = synchronization_internal::(anonymous_namespace)::arena_mu;
  uVar2 = synchronization_internal::(anonymous_namespace)::arena_mu & 2;
  LOCK();
  UNLOCK();
  bVar3 = 7 < synchronization_internal::(anonymous_namespace)::arena_mu;
  synchronization_internal::(anonymous_namespace)::arena_mu = uVar2;
  if (bVar3) {
    base_internal::SpinLock::SlowUnlock
              ((SpinLock *)&synchronization_internal::(anonymous_namespace)::arena_mu,uVar1);
  }
  this_00 = (Rep *)base_internal::LowLevelAlloc::AllocWithArena
                             (0x100168,synchronization_internal::(anonymous_namespace)::arena);
  Rep::Rep(this_00);
  this->rep_ = this_00;
  return;
}

Assistant:

GraphCycles::GraphCycles() {
  InitArenaIfNecessary();
  rep_ = new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Rep), arena))
      Rep;
}